

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaNormalTargetGenerator::LanguageLinkerDeviceRule
          (string *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this,string *config)

{
  _Alloc_hider _Var1;
  TargetType targetType;
  string *psVar2;
  string *name;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_e0;
  string local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  undefined8 local_90;
  char *local_88;
  size_type local_80;
  pointer local_78;
  undefined8 local_70;
  char *local_68;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  char *local_48;
  size_type local_40;
  pointer local_38;
  
  cmGeneratorTarget::GetLinkerLanguage
            (&local_c0,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  _Var1._M_p = local_c0._M_dataplus._M_p;
  targetType = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
  psVar2 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                    GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_e0,name);
  local_a0._M_len = local_c0._M_string_length;
  local_a0._M_str = _Var1._M_p;
  local_90 = 1;
  local_88 = "_";
  local_78 = (psVar2->_M_dataplus)._M_p;
  local_80 = psVar2->_M_string_length;
  local_70 = 0x10;
  local_68 = "_DEVICE_LINKER__";
  local_60 = local_e0._M_string_length;
  local_58 = local_e0._M_dataplus._M_p;
  local_50 = 1;
  local_48 = "_";
  local_38 = (config->_M_dataplus)._M_p;
  local_40 = config->_M_string_length;
  views._M_len = 7;
  views._M_array = &local_a0;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaNormalTargetGenerator::LanguageLinkerDeviceRule(
  const std::string& config) const
{
  return cmStrCat(
    this->TargetLinkLanguage(config), "_",
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()),
    "_DEVICE_LINKER__",
    cmGlobalNinjaGenerator::EncodeRuleName(
      this->GetGeneratorTarget()->GetName()),
    "_", config);
}